

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location,
          FileDescriptorProto *containing_file)

{
  int iVar1;
  Rep *pRVar2;
  Tokenizer *pTVar3;
  ulong uVar4;
  SourceCodeInfo *pSVar5;
  DescriptorProto *pDVar6;
  bool bVar7;
  int iVar8;
  DescriptorProto_ExtensionRange *obj;
  Message *descriptor;
  Type *pTVar9;
  ExtensionRangeOptions *from;
  ExtensionRangeOptions *this_00;
  Type *pTVar10;
  SourceCodeInfo_Location *pSVar11;
  uint uVar12;
  uint uVar13;
  Arena *pAVar14;
  int iVar15;
  int start;
  LocationRecorder start_location;
  LocationRecorder location;
  Token start_token;
  int local_d4;
  ulong local_d0;
  int local_c4;
  LocationRecorder *local_c0;
  RepeatedPtrFieldBase *local_b8;
  LocationRecorder local_b0;
  LocationRecorder local_98;
  ulong local_80;
  DescriptorProto *local_78;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  undefined1 local_60 [32];
  ColumnNumber local_40;
  FileDescriptorProto *local_38;
  
  local_c0 = extensions_location;
  local_38 = containing_file;
  bVar7 = Consume(this,"extensions");
  if (bVar7) {
    local_d0 = (ulong)(uint)(message->extension_range_).super_RepeatedPtrFieldBase.current_size_;
    local_b8 = &(message->extension_range_).super_RepeatedPtrFieldBase;
    local_78 = message;
    do {
      pDVar6 = local_78;
      LocationRecorder::LocationRecorder
                (&local_98,local_c0,
                 (local_78->extension_range_).super_RepeatedPtrFieldBase.current_size_);
      pRVar2 = (pDVar6->extension_range_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar2 == (Rep *)0x0) {
LAB_0033cee7:
        obj = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
                        (((RepeatedPtrFieldBase *)&local_b8->arena_)->arena_);
        descriptor = (Message *)internal::RepeatedPtrFieldBase::AddOutOfLineHelper(local_b8,obj);
      }
      else {
        iVar8 = (pDVar6->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar2->allocated_size <= iVar8) goto LAB_0033cee7;
        (pDVar6->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
        descriptor = (Message *)pRVar2->elements[iVar8];
      }
      LocationRecorder::RecordLegacyLocation(&local_98,descriptor,NUMBER);
      local_60._0_8_ = (Arena *)0x0;
      local_60._8_4_ = local_60._8_4_ & 0xffffff00;
      local_68._M_p = local_60 + 8;
      LocationRecorder::LocationRecorder(&local_b0,&local_98,1);
      pTVar3 = this->input_;
      local_70._0_4_ = (pTVar3->current_).type;
      std::__cxx11::string::_M_assign((string *)&local_68);
      local_40 = (pTVar3->current_).end_column;
      local_60._24_4_ = (pTVar3->current_).line;
      local_60._28_4_ = (pTVar3->current_).column;
      bVar7 = ConsumeInteger(this,&local_c4,"Expected field number range.");
      LocationRecorder::~LocationRecorder(&local_b0);
      if (!bVar7) {
LAB_0033d25f:
        if (local_68._M_p != local_60 + 8) {
          operator_delete(local_68._M_p);
        }
        LocationRecorder::~LocationRecorder(&local_98);
        return false;
      }
      bVar7 = TryConsume(this,"to");
      if (bVar7) {
        LocationRecorder::LocationRecorder(&local_b0,&local_98,2);
        bVar7 = TryConsume(this,"max");
        if (bVar7) {
          local_d4 = -2;
        }
        else {
          bVar7 = ConsumeInteger(this,&local_d4,"Expected integer.");
          if (!bVar7) {
            LocationRecorder::~LocationRecorder(&local_b0);
            goto LAB_0033d25f;
          }
        }
        iVar8 = local_d4;
        LocationRecorder::~LocationRecorder(&local_b0);
        iVar15 = local_c4;
      }
      else {
        LocationRecorder::LocationRecorder(&local_b0,&local_98,2);
        LocationRecorder::StartAt(&local_b0,(Token *)local_70);
        LocationRecorder::EndAt(&local_b0,(Token *)local_70);
        iVar15 = local_c4;
        local_d4 = local_c4;
        LocationRecorder::~LocationRecorder(&local_b0);
        iVar8 = iVar15;
      }
      *(int *)&descriptor[2].super_MessageLite._vptr_MessageLite = iVar15;
      *(byte *)&descriptor[1].super_MessageLite._vptr_MessageLite =
           *(byte *)&descriptor[1].super_MessageLite._vptr_MessageLite | 6;
      *(int *)((long)&descriptor[2].super_MessageLite._vptr_MessageLite + 4) = iVar8 + 1;
      if (local_68._M_p != local_60 + 8) {
        operator_delete(local_68._M_p);
      }
      LocationRecorder::~LocationRecorder(&local_98);
      bVar7 = TryConsume(this,",");
      pDVar6 = local_78;
    } while (bVar7);
    iVar8 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar8 != 0) {
LAB_0033d0b6:
      bVar7 = ConsumeEndOfDeclaration(this,";",local_c0);
      return bVar7;
    }
    local_80 = (ulong)(uint)(local_c0->location_->path_).current_size_;
    SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)local_70,(Arena *)0x0,false);
    pTVar9 = internal::RepeatedPtrFieldBase::
             Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                       (local_b8,(int)local_d0);
    *(byte *)(pTVar9->_has_bits_).has_bits_ = (byte)(pTVar9->_has_bits_).has_bits_[0] | 1;
    from = pTVar9->options_;
    if (from == (ExtensionRangeOptions *)0x0) {
      uVar4 = (pTVar9->super_Message).super_MessageLite._internal_metadata_.ptr_;
      pAVar14 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar14 = *(Arena **)pAVar14;
      }
      from = Arena::CreateMaybeMessage<google::protobuf::ExtensionRangeOptions>(pAVar14);
      pTVar9->options_ = from;
    }
    LocationRecorder::LocationRecorder(&local_98,local_c0,0,(SourceCodeInfo *)local_70);
    LocationRecorder::LocationRecorder(&local_b0,&local_98,3);
    bVar7 = Consume(this,"[");
    if (bVar7) {
      do {
        bVar7 = ParseOption(this,&from->super_Message,&local_b0,local_38,OPTION_ASSIGNMENT);
        if (!bVar7) goto LAB_0033d235;
        bVar7 = TryConsume(this,",");
      } while (bVar7);
      bVar7 = Consume(this,"]");
      LocationRecorder::~LocationRecorder(&local_b0);
      LocationRecorder::~LocationRecorder(&local_98);
      if (bVar7) {
        iVar8 = (int)local_d0;
        while( true ) {
          iVar8 = iVar8 + 1;
          iVar15 = (pDVar6->extension_range_).super_RepeatedPtrFieldBase.current_size_;
          if (iVar15 <= iVar8) break;
          pTVar9 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                             (local_b8,iVar8);
          *(byte *)(pTVar9->_has_bits_).has_bits_ = (byte)(pTVar9->_has_bits_).has_bits_[0] | 1;
          this_00 = pTVar9->options_;
          if (this_00 == (ExtensionRangeOptions *)0x0) {
            uVar4 = (pTVar9->super_Message).super_MessageLite._internal_metadata_.ptr_;
            pAVar14 = (Arena *)(uVar4 & 0xfffffffffffffffc);
            if ((uVar4 & 1) != 0) {
              pAVar14 = *(Arena **)pAVar14;
            }
            this_00 = Arena::CreateMaybeMessage<google::protobuf::ExtensionRangeOptions>(pAVar14);
            pTVar9->options_ = this_00;
          }
          ExtensionRangeOptions::CopyFrom(this_00,from);
        }
        if ((int)local_d0 < iVar15) {
          iVar8 = (int)local_80;
          uVar12 = local_60._8_4_;
          do {
            if (0 < (int)uVar12) {
              iVar15 = 0;
              do {
                pTVar10 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                                    ((RepeatedPtrFieldBase *)local_60,iVar15);
                if ((pTVar10->path_).current_size_ != iVar8 + 1) {
                  pSVar5 = this->source_code_info_;
                  pRVar2 = (pSVar5->location_).super_RepeatedPtrFieldBase.rep_;
                  if (pRVar2 == (Rep *)0x0) {
LAB_0033d2ea:
                    pSVar11 = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo_Location>
                                        ((pSVar5->location_).super_RepeatedPtrFieldBase.arena_);
                    pSVar11 = (SourceCodeInfo_Location *)
                              internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                        (&(pSVar5->location_).super_RepeatedPtrFieldBase,pSVar11);
                  }
                  else {
                    iVar1 = (pSVar5->location_).super_RepeatedPtrFieldBase.current_size_;
                    if (pRVar2->allocated_size <= iVar1) goto LAB_0033d2ea;
                    (pSVar5->location_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
                    pSVar11 = (SourceCodeInfo_Location *)pRVar2->elements[iVar1];
                  }
                  pTVar10 = internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                                      ((RepeatedPtrFieldBase *)local_60,iVar15);
                  SourceCodeInfo_Location::CopyFrom(pSVar11,pTVar10);
                  local_98.parser_._0_4_ = (undefined4)local_d0;
                  RepeatedField<int>::Set(&pSVar11->path_,(int)local_80,(int *)&local_98);
                }
                iVar15 = iVar15 + 1;
              } while (iVar15 < (int)local_60._8_4_);
              iVar15 = (local_78->extension_range_).super_RepeatedPtrFieldBase.current_size_;
              uVar12 = local_60._8_4_;
            }
            uVar13 = (int)local_d0 + 1;
            local_d0 = (ulong)uVar13;
          } while ((int)uVar13 < iVar15);
        }
        SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)local_70);
        goto LAB_0033d0b6;
      }
    }
    else {
LAB_0033d235:
      LocationRecorder::~LocationRecorder(&local_b0);
      LocationRecorder::~LocationRecorder(&local_98);
    }
    SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)local_70);
  }
  return false;
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location,
                             const FileDescriptorProto* containing_file) {
  // Parse the declaration.
  DO(Consume("extensions"));

  int old_range_size = message->extension_range_size();

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(range,
                                  DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  if (LookingAt("[")) {
    int range_number_index = extensions_location.CurrentPathSize();
    SourceCodeInfo info;

    // Parse extension range options in the first range.
    ExtensionRangeOptions* options =
        message->mutable_extension_range(old_range_size)->mutable_options();

    {
      LocationRecorder index_location(
          extensions_location, 0 /* we fill this in w/ actual index below */,
          &info);
      LocationRecorder location(
          index_location, DescriptorProto::ExtensionRange::kOptionsFieldNumber);
      DO(Consume("["));

      do {
        DO(ParseOption(options, location, containing_file, OPTION_ASSIGNMENT));
      } while (TryConsume(","));

      DO(Consume("]"));
    }

    // Then copy the extension range options to all of the other ranges we've
    // parsed.
    for (int i = old_range_size + 1; i < message->extension_range_size(); i++) {
      message->mutable_extension_range(i)->mutable_options()->CopyFrom(
          *options);
    }
    // and copy source locations to the other ranges, too
    for (int i = old_range_size; i < message->extension_range_size(); i++) {
      for (int j = 0; j < info.location_size(); j++) {
        if (info.location(j).path_size() == range_number_index + 1) {
          // this location's path is up to the extension range index, but
          // doesn't include options; so it's redundant with location above
          continue;
        }
        SourceCodeInfo_Location* dest = source_code_info_->add_location();
        *dest = info.location(j);
        dest->set_path(range_number_index, i);
      }
    }
  }

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}